

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::setUniform
          (ExplicitUniformLocationCaseBase *this,Uniform *uniform,CompiledProgram *program)

{
  UniformValue *this_00;
  int location;
  CallLogWrapper *this_01;
  GLuint program_00;
  GLenum GVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer puVar5;
  GLfloat *pGVar6;
  GLint *pGVar7;
  GLuint *pGVar8;
  byte bVar9;
  long lVar10;
  pointer pUVar11;
  int arrayElement;
  ulong uVar12;
  ostringstream name;
  long *local_1e0;
  long local_1d0 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  undefined1 local_1a8 [376];
  
  puVar5 = (program->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((program->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    uVar12 = 0;
    bVar9 = 0;
    do {
      bVar2 = DefOccurence::occurs(&uniform->declOccurence,puVar5[uVar12]);
      bVar3 = false;
      if (bVar2) {
        bVar3 = DefOccurence::occurs
                          (&uniform->usageOccurence,
                           (program->stages).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12]);
      }
      bVar9 = bVar9 | bVar3;
      uVar12 = uVar12 + 1;
      puVar5 = (program->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(program->stages).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2));
    if (bVar9 != 0) {
      if ((uniform->type).baseType == 0) {
        pUVar11 = (uniform->childUniforms).
                  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((uniform->childUniforms).
            super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            ._M_impl.super__Vector_impl_data._M_finish != pUVar11) {
          lVar10 = 0;
          uVar12 = 0;
          do {
            setUniform(this,(Uniform *)((long)&(pUVar11->type).enumType + lVar10),program);
            uVar12 = uVar12 + 1;
            pUVar11 = (uniform->childUniforms).
                      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar10 = lVar10 + 0x1d8;
          } while (uVar12 < (ulong)(((long)(uniform->childUniforms).
                                           super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pUVar11 >> 3) * -0x34115b1e5f75270d));
        }
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_1c0,&program->stages);
        bVar2 = LayoutSpecifierBase::isImplicit
                          (&(uniform->location).super_LayoutSpecifierBase,&local_1c0);
        if (local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(uniform->name)._M_dataplus._M_p,
                     (uniform->name)._M_string_length);
          UniformType::streamArrayStr(&uniform->type,(ostringstream *)local_1a8,0);
          program_00 = program->name;
          std::__cxx11::stringbuf::str();
          iVar4 = glu::CallLogWrapper::glGetUniformLocation
                            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
                             program_00,(GLchar *)local_1e0);
          if (local_1e0 != local_1d0) {
            operator_delete(local_1e0,local_1d0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        }
        else {
          iVar4 = (uniform->location).super_LayoutSpecifierBase.val;
        }
        if (0 < (uniform->type).arraySize) {
          this_01 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
          this_00 = &uniform->value;
          arrayElement = 0;
          do {
            location = iVar4 + arrayElement;
            GVar1 = (uniform->type).enumType;
            if ((int)GVar1 < 0x8b50) {
              if (GVar1 == 0x1404) goto switchD_00bc0ad3_caseD_8b5e;
              if (GVar1 == 0x1405) {
                pGVar8 = (GLuint *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform1ui(this_01,location,*pGVar8);
              }
              else {
                if (GVar1 != 0x1406) goto switchD_00bc0ad3_caseD_8b56;
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform1f(this_01,location,*pGVar6);
              }
            }
            else {
              switch(GVar1) {
              case 0x8b50:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform2fv(this_01,location,1,pGVar6);
                break;
              case 0x8b51:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform3fv(this_01,location,1,pGVar6);
                break;
              case 0x8b52:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform4fv(this_01,location,1,pGVar6);
                break;
              case 0x8b53:
                pGVar7 = (GLint *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform2iv(this_01,location,1,pGVar7);
                break;
              case 0x8b54:
                pGVar7 = (GLint *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform3iv(this_01,location,1,pGVar7);
                break;
              case 0x8b55:
                pGVar7 = (GLint *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform4iv(this_01,location,1,pGVar7);
                break;
              default:
switchD_00bc0ad3_caseD_8b56:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                              ,0x5e1,
                              "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setUniform(const Uniform &, const CompiledProgram &)"
                             );
              case 0x8b5a:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix2fv(this_01,location,1,'\0',pGVar6);
                break;
              case 0x8b5b:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix3fv(this_01,location,1,'\0',pGVar6);
                break;
              case 0x8b5c:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix4fv(this_01,location,1,'\0',pGVar6);
                break;
              case 0x8b5e:
switchD_00bc0ad3_caseD_8b5e:
                pGVar7 = (GLint *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniform1i(this_01,location,*pGVar7);
                break;
              case 0x8b65:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix2x3fv(this_01,location,1,'\0',pGVar6);
                break;
              case 0x8b66:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix2x4fv(this_01,location,1,'\0',pGVar6);
                break;
              case 0x8b67:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix3x2fv(this_01,location,1,'\0',pGVar6);
                break;
              case 0x8b68:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix3x4fv(this_01,location,1,'\0',pGVar6);
                break;
              case 0x8b69:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix4x2fv(this_01,location,1,'\0',pGVar6);
                break;
              case 0x8b6a:
                pGVar6 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
                glu::CallLogWrapper::glUniformMatrix4x3fv(this_01,location,1,'\0',pGVar6);
              }
            }
            arrayElement = arrayElement + 1;
          } while (arrayElement < (uniform->type).arraySize);
        }
      }
    }
  }
  return;
}

Assistant:

void setUniform(const Uniform& uniform, const CompiledProgram& program)
	{

		bool used = false;
		for (size_t i = 0; i < program.stages.size(); i++)
		{
			used |= uniform.declOccurence.occurs(program.stages[i]) && uniform.usageOccurence.occurs(program.stages[i]);
		}
		if (!used)
			return;

		if (uniform.type.isStruct())
		{
			for (size_t j = 0; j < uniform.childUniforms.size(); j++)
			{
				setUniform(uniform.childUniforms[j], program);
			}
		}
		else
		{
			GLint loc;
			if (uniform.location.isImplicit(program.stages))
			{
				std::ostringstream name;
				name << uniform.getName();
				uniform.type.streamArrayStr(name, 0);
				loc = glGetUniformLocation(program.name, name.str().c_str());
			}
			else
			{
				loc = uniform.location.val;
			}

			for (int arrayElem = 0; arrayElem < uniform.type.arraySize; arrayElem++)
			{
				switch (uniform.type.enumType)
				{
				case GL_FLOAT:
					glUniform1f(loc, *(GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC2:
					glUniform2fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC3:
					glUniform3fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC4:
					glUniform4fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2:
					glUniformMatrix2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3:
					glUniformMatrix3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4:
					glUniformMatrix4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2x3:
					glUniformMatrix2x3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4x3:
					glUniformMatrix4x3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2x4:
					glUniformMatrix2x4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3x4:
					glUniformMatrix3x4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3x2:
					glUniformMatrix3x2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4x2:
					glUniformMatrix4x2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT:
				case GL_SAMPLER_2D:
					glUniform1i(loc, *(GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC2:
					glUniform2iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC3:
					glUniform3iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC4:
					glUniform4iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_UNSIGNED_INT:
					glUniform1ui(loc, *(GLuint*)uniform.value.getPtr(arrayElem));
					break;
				default:
					assert(0);
				}
				loc++;
			}
		}
	}